

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O0

string * __thiscall
Diligent::BasicFileSystem::SimplifyPath_abi_cxx11_
          (string *__return_storage_ptr__,BasicFileSystem *this,Char *Path,Char Slash)

{
  bool bVar1;
  Char *pCVar2;
  value_type *pvVar3;
  reference pMVar4;
  vector<MiniStringView,_std::allocator<MiniStringView>_> *pvVar5;
  string *psVar6;
  char (*Args_1) [31];
  bool local_f9;
  undefined1 local_d8 [8];
  string msg_1;
  value_type *Cmp_1;
  size_t i;
  MiniStringView *Cmp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MiniStringView,_std::allocator<MiniStringView>_> *__range1;
  size_t Len;
  bool UseLeadingSlash;
  size_type NumComponents;
  vector<MiniStringView,_std::allocator<MiniStringView>_> PathComponents;
  string msg;
  allocator local_1a;
  char local_19;
  BasicFileSystem *pBStack_18;
  Char Slash_local;
  Char *Path_local;
  string *SimplifiedPath;
  
  local_19 = (char)Path;
  pBStack_18 = this;
  Path_local = (Char *)__return_storage_ptr__;
  if (this == (BasicFileSystem *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  }
  else {
    psVar6 = __return_storage_ptr__;
    if (local_19 == '\0') {
      local_19 = '/';
    }
    else {
      bVar1 = IsSlash(local_19);
      if (!bVar1) {
        FormatString<char[23]>
                  ((string *)
                   &PathComponents.
                    super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (char (*) [23])"Incorrect slash symbol");
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        psVar6 = (string *)0xea;
        DebugAssertionFailed
                  (pCVar2,"SimplifyPath",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
                   ,0xea);
        std::__cxx11::string::~string
                  ((string *)
                   &PathComponents.
                    super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    SplitPath<Diligent::BasicFileSystem::SimplifyPath[abi:cxx11](char_const*,char)::MiniStringView>
              ((vector<MiniStringView,_std::allocator<MiniStringView>_> *)&NumComponents,
               (Diligent *)pBStack_18,(Char *)0x1,SUB81(psVar6,0));
    pvVar3 = (value_type *)
             std::vector<MiniStringView,_std::allocator<MiniStringView>_>::size
                       ((vector<MiniStringView,_std::allocator<MiniStringView>_> *)&NumComponents);
    local_f9 = false;
    if (local_19 == '/') {
      local_f9 = IsSlash((Char)*(Diligent *)pBStack_18);
    }
    Args_1 = (char (*) [31])0x1;
    __range1 = (vector<MiniStringView,_std::allocator<MiniStringView>_> *)
               (long)(int)(uint)(local_f9 != false);
    __end1 = std::vector<MiniStringView,_std::allocator<MiniStringView>_>::begin
                       ((vector<MiniStringView,_std::allocator<MiniStringView>_> *)&NumComponents);
    Cmp = (MiniStringView *)
          std::vector<MiniStringView,_std::allocator<MiniStringView>_>::end
                    ((vector<MiniStringView,_std::allocator<MiniStringView>_> *)&NumComponents);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_MiniStringView_*,_std::vector<MiniStringView,_std::allocator<MiniStringView>_>_>
                                       *)&Cmp), bVar1) {
      pMVar4 = __gnu_cxx::
               __normal_iterator<const_MiniStringView_*,_std::vector<MiniStringView,_std::allocator<MiniStringView>_>_>
               ::operator*(&__end1);
      Args_1 = (char (*) [31])pMVar4->Start;
      __range1 = (vector<MiniStringView,_std::allocator<MiniStringView>_> *)
                 (((long)pMVar4->End - (long)Args_1) + (long)__range1);
      __gnu_cxx::
      __normal_iterator<const_MiniStringView_*,_std::vector<MiniStringView,_std::allocator<MiniStringView>_>_>
      ::operator++(&__end1);
    }
    if (pvVar3 != (value_type *)0x0) {
      __range1 = (vector<MiniStringView,_std::allocator<MiniStringView>_> *)
                 ((undefined1 *)((long)&pvVar3[-1].End + 7) + (long)__range1);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    if (local_f9 != false) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    for (Cmp_1 = (value_type *)0x0; Cmp_1 < pvVar3; Cmp_1 = (value_type *)((long)&Cmp_1->Start + 1))
    {
      if (Cmp_1 != (value_type *)0x0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      msg_1.field_2._8_8_ =
           std::vector<MiniStringView,_std::allocator<MiniStringView>_>::operator[]
                     ((vector<MiniStringView,_std::allocator<MiniStringView>_> *)&NumComponents,
                      (size_type)Cmp_1);
      std::__cxx11::string::append<char_const*,void>
                ((string *)__return_storage_ptr__,((const_reference)msg_1.field_2._8_8_)->Start,
                 ((const_reference)msg_1.field_2._8_8_)->End);
    }
    pvVar5 = (vector<MiniStringView,_std::allocator<MiniStringView>_> *)
             std::__cxx11::string::length();
    if (pvVar5 != __range1) {
      FormatString<char[26],char[31]>
                ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SimplifiedPath.length() == Len",Args_1);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SimplifyPath",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
                 ,0x11b);
      std::__cxx11::string::~string((string *)local_d8);
    }
    std::vector<MiniStringView,_std::allocator<MiniStringView>_>::~vector
              ((vector<MiniStringView,_std::allocator<MiniStringView>_> *)&NumComponents);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BasicFileSystem::SimplifyPath(const Char* Path, Char Slash)
{
    if (Path == nullptr)
        return "";

    if (Slash != 0)
        DEV_CHECK_ERR(IsSlash(Slash), "Incorrect slash symbol");
    else
        Slash = SlashSymbol;

    struct MiniStringView
    {
        MiniStringView(const char* _Start,
                       const char* _End) :
            Start{_Start},
            End{_End}
        {}

        bool operator==(const char* Str) const noexcept
        {
            const auto Len = End - Start;
            return strncmp(Str, Start, Len) == 0 && Str[Len] == '\0';
        }

        bool operator!=(const char* str) const noexcept
        {
            return !(*this == str);
        }

        const char* const Start;
        const char* const End;
    };

    const auto PathComponents  = Diligent::SplitPath<MiniStringView>(Path, true);
    const auto NumComponents   = PathComponents.size();
    const auto UseLeadingSlash = Slash == '/' && IsSlash(Path[0]);

    size_t Len = UseLeadingSlash ? 1 : 0;
    for (const auto& Cmp : PathComponents)
        Len += Cmp.End - Cmp.Start;
    if (NumComponents > 0)
        Len += NumComponents - 1;

    std::string SimplifiedPath;
    SimplifiedPath.reserve(Len);
    if (UseLeadingSlash)
        SimplifiedPath.push_back(Slash);

    for (size_t i = 0; i < NumComponents; ++i)
    {
        if (i > 0)
            SimplifiedPath.push_back(Slash);
        const auto& Cmp = PathComponents[i];
        SimplifiedPath.append(Cmp.Start, Cmp.End);
    }
    VERIFY_EXPR(SimplifiedPath.length() == Len);

    return SimplifiedPath;
}